

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rectangle.h
# Opt level: O0

rectangle * dlib::centered_rect(long x,long y,unsigned_long width,unsigned_long height)

{
  long *plVar1;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  rectangle *in_RDI;
  long in_R8;
  rectangle *result;
  
  rectangle::rectangle(in_RDI);
  rectangle::set_left(in_RDI,in_RSI - in_RCX / 2);
  rectangle::set_top(in_RDI,in_RDX - in_R8 / 2);
  plVar1 = rectangle::left(in_RDI);
  rectangle::set_right(in_RDI,*plVar1 + in_RCX + -1);
  plVar1 = rectangle::top(in_RDI);
  rectangle::set_bottom(in_RDI,*plVar1 + in_R8 + -1);
  return in_RDI;
}

Assistant:

inline const rectangle centered_rect (
        long x,
        long y,
        unsigned long width,
        unsigned long height
    )
    {
        rectangle result;
        result.set_left ( x - static_cast<long>(width) / 2 );
        result.set_top ( y - static_cast<long>(height) / 2 );
        result.set_right ( result.left() + width - 1 );
        result.set_bottom ( result.top() + height - 1 );
        return result;
    }